

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Type::ideal_size(Fl_Widget_Type *this,int *w,int *h)

{
  Fl_Widget *pFVar1;
  int iVar2;
  
  pFVar1 = this->o;
  *h = (pFVar1->label_).size;
  Fl_Label::measure(&pFVar1->label_,w,h);
  iVar2 = Fl::box_dw((uint)this->o->box_);
  *w = *w + iVar2;
  iVar2 = Fl::box_dh((uint)this->o->box_);
  *h = *h + iVar2;
  if (*w < 0xf) {
    *w = 0xf;
  }
  if (*h < 0xf) {
    *h = 0xf;
  }
  return;
}

Assistant:

void
Fl_Widget_Type::ideal_size(int &w, int &h) {
  h = o->labelsize();
  o->measure_label(w, h);

  w += Fl::box_dw(o->box());
  h += Fl::box_dh(o->box());

  if (w < 15) w = 15;
  if (h < 15) h = 15;
}